

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool DerBase::DecodeSetOrSequenceOf<SingleResponse>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<SingleResponse,_std::allocator<SingleResponse>_> *out)

{
  SingleResponse *pSVar1;
  SingleResponse *pSVar2;
  size_t sVar3;
  size_t sVar4;
  size_t *psVar5;
  size_t *psVar6;
  bool bVar7;
  overflow_error *this;
  SingleResponse *this_00;
  pointer pEVar8;
  undefined1 local_288 [8];
  SingleResponse t;
  size_t local_60;
  size_t cbElement;
  vector<SingleResponse,_std::allocator<SingleResponse>_> *local_50;
  size_t *local_48;
  size_t *local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  pSVar1 = (out->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (out->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar1;
  cbElement = (size_t)pIn;
  local_50 = out;
  local_48 = cbSize;
  local_40 = cbPrefix;
  if (pSVar2 != pSVar1) {
    do {
      SingleResponse::~SingleResponse(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
    (local_50->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  psVar6 = local_40;
  psVar5 = local_48;
  bVar7 = DecodeSequenceOrSet(type,(uchar *)cbElement,cbIn,local_40,local_48,local_31);
  if (bVar7) {
    if (local_31[0] == true) {
      *psVar6 = 2;
      *psVar5 = 0;
    }
    else {
      pEVar8 = (pointer)*psVar6;
      t.singleExtensions.values.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(pEVar8->super_DerBase)._vptr_DerBase + *psVar5);
      do {
        local_60 = 0;
        t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        local_288 = (undefined1  [8])&PTR_EncodedSize_00150888;
        t.certID.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00150840;
        t.certID.hashAlgorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.super_DerBase.cbData = (size_t)&PTR_EncodedSize_001503b8;
        t.certID.hashAlgorithm.algorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.hashAlgorithm.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151908;
        t.certID.hashAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.certID.hashAlgorithm.algorithm.super_DerBase.cbData = 0;
        t.certID.hashAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.certID.hashAlgorithm.parameters.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.hashAlgorithm.algorithm.oidIndex = (size_t)&PTR_EncodedSize_00151828;
        t.certID.hashAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.certID.hashAlgorithm.parameters.super_DerBase.cbData = 0;
        t.certID.hashAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.certID.issuerNameHash.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.hashAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151a70;
        t.certID.issuerNameHash.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.certID.issuerNameHash.super_DerBase.cbData = 0;
        t.certID.issuerNameHash.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.certID.issuerKeyHash.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.issuerNameHash.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151a70;
        t.certID.issuerKeyHash.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.certID.issuerKeyHash.super_DerBase.cbData = 0;
        t.certID.issuerKeyHash.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.certID.serialNumber.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.issuerKeyHash.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151ab8;
        t.certID.serialNumber.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.certID.serialNumber.super_DerBase.cbData = 0;
        t.certID.serialNumber.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.certStatus.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certID.serialNumber.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_001506d0;
        t.certStatus.super_DerBase.cbData._0_4_ = 2;
        t.certStatus.revoked.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certStatus._16_8_ = &PTR_EncodedSize_00150688;
        t.certStatus.revoked.revocationTime.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certStatus.revoked.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151998;
        t.certStatus.revoked.revocationTime.super_DerBase.cbData =
             (size_t)&t.certStatus.revoked.revocationTime.value._M_string_length;
        t.certStatus.revoked.revocationTime.value._M_dataplus._M_p = (pointer)0x0;
        t.certStatus.revoked.revocationTime.value._M_string_length._0_1_ = 0;
        t.certStatus.revoked.revocationReason.super_Enumerated.super_DerBase._vptr_DerBase =
             (_func_int **)0x0;
        t.certStatus.revoked.revocationReason.super_Enumerated.super_DerBase.cbData._0_1_ = 0;
        t.certStatus.revoked.revocationTime.value.field_2._8_8_ = &PTR_EncodedSize_00151650;
        t.thisUpdate.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.certStatus.revoked.revocationReason.super_Enumerated._16_8_ = &PTR_EncodedSize_00151998;
        t.thisUpdate.super_DerBase.cbData = (size_t)&t.thisUpdate.value._M_string_length;
        t.thisUpdate.value._M_dataplus._M_p = (pointer)0x0;
        t.thisUpdate.value._M_string_length._0_1_ = 0;
        t.nextUpdate.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.thisUpdate.value.field_2._8_8_ = &PTR_EncodedSize_00151998;
        t.nextUpdate.super_DerBase.cbData = (size_t)&t.nextUpdate.value._M_string_length;
        t.nextUpdate.value._M_dataplus._M_p = (pointer)0x0;
        t.nextUpdate.value._M_string_length._0_1_ = 0;
        t.singleExtensions.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.nextUpdate.value.field_2._8_8_ = &PTR_EncodedSize_00150328;
        t.singleExtensions.values.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.singleExtensions.super_DerBase.cbData = 0;
        t.singleExtensions.values.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (t.singleExtensions.values.super__Vector_base<Extension,_std::allocator<Extension>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage < pEVar8) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar7 = SingleResponse::Decode
                          ((SingleResponse *)local_288,
                           (uchar *)((long)&(pEVar8->super_DerBase)._vptr_DerBase + cbElement),
                           (long)t.singleExtensions.values.
                                 super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pEVar8,&local_60)
        ;
        sVar3 = local_60;
        if (!bVar7) {
          if (local_60 == 0) {
            *local_40 = 0;
            *local_48 = 0;
          }
          SingleResponse::~SingleResponse((SingleResponse *)local_288);
          return false;
        }
        std::vector<SingleResponse,_std::allocator<SingleResponse>_>::push_back
                  (local_50,(SingleResponse *)local_288);
        pEVar8 = (pointer)((long)&(pEVar8->super_DerBase)._vptr_DerBase + sVar3);
        sVar3 = *local_40;
        sVar4 = *local_48;
        SingleResponse::~SingleResponse((SingleResponse *)local_288);
      } while (pEVar8 != (pointer)(sVar3 + sVar4));
    }
    bVar7 = true;
  }
  else {
    bVar7 = false;
    *psVar6 = 0;
    *psVar5 = 0;
  }
  return bVar7;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}